

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O1

int pt_evt_decode_psb(pt_event_decoder *decoder)

{
  pt_event_queue *evq;
  anon_union_16_19_41f219a3_for_payload *packet_00;
  pt_time *time;
  pt_time_cal *tcal;
  byte bVar1;
  pt_ip_compression pVar2;
  pt_exec_mode pVar3;
  int iVar4;
  uint uVar5;
  pt_event *ppVar6;
  pt_event *ppVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  pt_packet packet;
  pt_packet_decoder pacdec;
  pt_packet local_170;
  pt_packet_decoder local_158;
  
  evq = &decoder->evq;
  iVar4 = pt_evq_pending(evq,0xffffffff);
  uVar10 = 0xfffffffa;
  if (iVar4 == 0) {
    pt_last_ip_init(&decoder->ip);
    decoder->field_0x72c = decoder->field_0x72c & 0xef;
    ppVar6 = pt_evq_enqueue(evq,1);
    if (ppVar6 == (pt_event *)0x0) {
      uVar10 = 0xfffffff7;
    }
    else {
      ppVar6->field_0x4 = ppVar6->field_0x4 | 2;
      packet_00 = &(decoder->packet).payload;
      time = &decoder->time;
      tcal = &decoder->tcal;
      do {
        pt_evt_fetch_packet(decoder);
        uVar10 = 0;
        switch((decoder->packet).type) {
        case ppt_invalid:
          uVar10 = decoder->status;
          break;
        default:
          uVar10 = 0xfffffffa;
          break;
        case ppt_pad:
          break;
        case ppt_psbend:
          if ((decoder->field_0x72c & 0x10) == 0) {
            ppVar6->type = ptev_disabled;
            ppVar6->field_0x4 = ppVar6->field_0x4 | 1;
            return 1;
          }
          goto LAB_001057ef;
        case ppt_fup:
          pVar2 = (decoder->packet).payload.ip.ipc;
          bVar11 = pVar2 != pt_ipc_suppressed;
          if (decoder == (pt_event_decoder *)0x0) {
            uVar10 = 0xffffffff;
          }
          else {
            if ((undefined1  [64])
                ((undefined1  [64])(decoder->pacdec).config.errata & (undefined1  [64])0x1) !=
                (undefined1  [64])0x0) {
              memcpy(&local_158,decoder,0x128);
              uVar5 = uVar10;
              do {
                uVar10 = pt_pkt_next(&local_158,&local_170,0x18);
                bVar11 = false;
                if ((int)uVar10 < 0) {
                  if (uVar10 == 0xfffffff9) {
                    uVar10 = 0;
                  }
                }
                else {
                  bVar11 = false;
                  if (local_170.type < ppt_exstop) {
                    if ((0x27f814U >> (local_170.type & (ppt_evd|ppt_psb)) & 1) == 0) {
                      uVar10 = 0;
                      if (local_170.type == ppt_tip_pge) {
                        uVar10 = 1;
                        bVar11 = false;
                      }
                    }
                    else {
                      uVar10 = uVar5;
                      bVar11 = true;
                    }
                  }
                  else {
                    uVar10 = 0;
                  }
                }
                uVar5 = uVar10;
              } while (bVar11);
              if ((int)uVar10 < 0) break;
              bVar11 = uVar10 == 0 && pVar2 != pt_ipc_suppressed;
            }
            decoder->field_0x72c = decoder->field_0x72c & 0xef | bVar11 << 4;
            uVar10 = 0;
            if (bVar11 != false) {
              uVar10 = pt_last_ip_update_ip(&decoder->ip,&packet_00->ip,(pt_config *)decoder);
            }
          }
          break;
        case ppt_mode:
          pVar2 = (decoder->packet).payload.ip.ipc;
          if (pVar2 == 0x20) {
            ppVar7 = pt_evq_enqueue(evq,1);
            if (ppVar7 == (pt_event *)0x0) goto LAB_001056de;
            ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
            ppVar7->type = ptev_tsx;
            bVar9 = (decoder->packet).payload.cfe.vector & 1;
            bVar1 = (ppVar7->variant).ptwrite.size;
            (ppVar7->variant).ptwrite.size = bVar1 & 0xfe | bVar9;
            bVar8 = (decoder->packet).payload.cfe.vector & 2;
            bVar9 = bVar1 & 0xfc | bVar9;
LAB_001056d5:
            (ppVar7->variant).ptwrite.size = bVar9 | bVar8;
LAB_001056da:
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            if (pVar2 == pt_ipc_suppressed) {
              bVar9 = decoder->field_0x72c;
              if ((bVar9 & 1) == 0) {
                bVar8 = (decoder->packet).payload.cfe.vector;
                decoder->field_0x72c =
                     (bVar8 & 1) << 3 | bVar8 * '\x02' & 4 | bVar9 & 0xf1 | 1 | bVar8 >> 1 & 2;
LAB_0010543b:
                ppVar7 = pt_evq_enqueue(evq,1);
                uVar10 = 0xfffffff7;
                if (ppVar7 != (pt_event *)0x0) {
                  ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
                  ppVar7->type = ptev_exec_mode;
                  bVar9 = (decoder->packet).payload.cfe.vector;
                  bVar11 = (bVar9 & 2) == 0;
                  pVar3 = (uint)bVar11 * 3;
                  if ((bVar9 & 1) == 0) {
                    pVar3 = ptem_32bit - bVar11;
                  }
                  (ppVar7->variant).exec_mode.mode = pVar3;
                  uVar10 = 0;
                  if ((undefined1  [16])
                      ((undefined1  [16])(decoder->flags).variant & (undefined1  [16])0x2) !=
                      (undefined1  [16])0x0) {
                    ppVar7 = pt_evq_enqueue(evq,1);
                    uVar10 = 0xfffffff7;
                    if (ppVar7 != (pt_event *)0x0) {
                      ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
                      ppVar7->type = ptev_iflags;
                      (ppVar7->variant).pwre.state =
                           (ppVar7->variant).pwre.state & 0xfe |
                           (decoder->packet).payload.cfe.vector >> 2 & 1;
                      goto LAB_001056da;
                    }
                  }
                }
              }
              else if (((undefined1  [16])
                        ((undefined1  [16])(decoder->flags).variant & (undefined1  [16])0x2) ==
                        (undefined1  [16])0x0) ||
                      (uVar10 = 0xffffffea,
                      (((decoder->packet).payload.cfe.vector >> 2 ^ bVar9 >> 1) & 1) == 0)) {
                bVar8 = (decoder->packet).payload.cfe.vector;
                uVar10 = 0xffffffea;
                if ((((bVar8 >> 1 ^ bVar9 >> 2) & 1) == 0) && (((bVar8 ^ bVar9 >> 3) & 1) == 0))
                goto LAB_0010543b;
              }
            }
          }
          break;
        case ppt_pip:
          ppVar7 = pt_evq_enqueue(evq,1);
          if (ppVar7 != (pt_event *)0x0) {
            ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
            ppVar7->type = ptev_async_paging;
            (ppVar7->variant).enabled.ip = (uint64_t)(decoder->packet).payload.mode;
            bVar8 = (decoder->packet).payload.ptw.plc & 1;
            bVar9 = (ppVar7->variant).ptwrite.size & 0xfe;
            goto LAB_001056d5;
          }
          goto LAB_001056de;
        case ppt_vmcs:
          ppVar7 = pt_evq_enqueue(evq,1);
          if (ppVar7 != (pt_event *)0x0) {
            ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
            ppVar7->type = ptev_async_vmcs;
LAB_001055eb:
            (ppVar7->variant).enabled.ip = (uint64_t)(decoder->packet).payload.mode;
            goto LAB_001056da;
          }
          goto LAB_001056de;
        case ppt_cbr:
          uVar10 = pt_tcal_header_cbr(tcal,&packet_00->cbr,(pt_config *)decoder);
          if (-1 < (int)uVar10 || uVar10 == 0xfffffff6) {
            uVar5 = pt_time_update_cbr(time,&packet_00->cbr,(pt_config *)decoder);
            uVar10 = (int)uVar5 >> 0x1f & uVar5;
            if (uVar5 == 0xfffffff6) {
              uVar10 = 0;
            }
          }
          if (-1 < (int)uVar10) {
            ppVar7 = pt_evq_enqueue(evq,1);
            if (ppVar7 == (pt_event *)0x0) goto LAB_001056de;
            ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
            ppVar7->type = ptev_cbr;
            *(ushort *)&ppVar7->variant = (ushort)(packet_00->tnt).bit_size;
            goto LAB_001056da;
          }
          break;
        case ppt_tsc:
          uVar10 = pt_tcal_header_tsc(tcal,&packet_00->tsc,(pt_config *)decoder);
          if (-1 < (int)uVar10 || uVar10 == 0xfffffff6) {
            uVar5 = pt_time_update_tsc(time,&packet_00->tsc,(pt_config *)decoder);
            uVar10 = (int)uVar5 >> 0x1f & uVar5;
            if (uVar5 == 0xfffffff6) {
              uVar10 = 0;
            }
          }
          break;
        case ppt_tma:
          uVar10 = pt_evt_apply_tma(time,tcal,&packet_00->tma,(pt_config *)decoder);
          break;
        case ppt_mtc:
          uVar10 = pt_evt_apply_mtc(time,tcal,&packet_00->mtc,(pt_config *)decoder);
          break;
        case ppt_cyc:
          uVar10 = pt_evt_apply_cyc(time,tcal,&packet_00->cyc,(pt_config *)decoder);
          break;
        case ppt_ovf:
          if ((decoder->field_0x72c & 0x10) == 0) {
            ppVar7 = pt_evq_dequeue(evq,1);
            if (ppVar7 == ppVar6) {
              return 1;
            }
            return -1;
          }
LAB_001057ef:
          ppVar6->type = ptev_enabled;
          return 1;
        case ppt_mnt:
          ppVar7 = pt_evq_enqueue(evq,1);
          if (ppVar7 != (pt_event *)0x0) {
            ppVar7->type = ptev_mnt;
            goto LAB_001055eb;
          }
LAB_001056de:
          uVar10 = 0xfffffff7;
        }
      } while (-1 < (int)uVar10);
    }
  }
  return uVar10;
}

Assistant:

static int pt_evt_decode_psb(struct pt_event_decoder *decoder)
{
	const struct pt_packet *packet;
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	/* We must not carry partial events across PSB. */
	if (pt_evq_pending(&decoder->evq, UINT32_MAX))
		return -pte_bad_context;

	pt_last_ip_init(&decoder->ip);
	decoder->enabled = 0;

	/* Create an event that will represent the enabled/disabled status.
	 *
	 * We do not know the status, yet, but we want the event to be first.
	 * We will fill in the details when we reach PSBEND.
	 */
	ev = pt_evq_enqueue(&decoder->evq, evb_psbend);
	if (!ev)
		return -pte_nomem;

	ev->status_update = 1;

	packet = &decoder->packet;
	for (;;) {
		errcode = pt_evt_fetch_packet(decoder);
		if (errcode < 0)
			return errcode;

		switch (packet->type) {
		case ppt_fup:
			errcode = pt_evt_header_fup(decoder,
						    &packet->payload.ip);
			break;

		case ppt_mode:
			errcode = pt_evt_header_mode(decoder,
						     &packet->payload.mode);
			break;

		case ppt_pip:
			errcode = pt_evt_header_pip(decoder,
						    &packet->payload.pip);
			break;

		case ppt_vmcs:
			errcode = pt_evt_header_vmcs(decoder,
						     &packet->payload.vmcs);
			break;

		case ppt_mnt:
			errcode = pt_evt_header_mnt(decoder,
						    &packet->payload.mnt);
			break;

		case ppt_tsc:
			errcode = pt_evt_header_tsc(decoder,
						    &packet->payload.tsc);
			break;

		case ppt_cbr:
			errcode = pt_evt_header_cbr(decoder,
						    &packet->payload.cbr);
			break;

		case ppt_tma:
			errcode = pt_evt_header_tma(decoder,
						    &packet->payload.tma);
			break;

		case ppt_mtc:
			errcode = pt_evt_header_mtc(decoder,
						    &packet->payload.mtc);
			break;

		case ppt_cyc:
			errcode = pt_evt_header_cyc(decoder,
						    &packet->payload.cyc);
			break;

		case ppt_psbend:
			if (decoder->enabled)
				ev->type = ptev_enabled;
			else {
				ev->type = ptev_disabled;
				ev->ip_suppressed = 1;
			}

			return 1;

		case ppt_ovf: {
			/* When PSB+ ends with an OVF, we remove the event we
			 * created initially if tracing is not enabled.
			 *
			 * We may have lost the FUP and end up with an invalid
			 * status update that might be diagnosed before we
			 * reach the overflow event.
			 */
			if (decoder->enabled)
				ev->type = ptev_enabled;
			else {
				const struct pt_event *head;

				head = pt_evq_dequeue(&decoder->evq,
						      evb_psbend);
				if (head != ev)
					return -pte_internal;
			}

			return 1;
		}

		case ppt_pad:
			break;

		case ppt_invalid:
			errcode = decoder->status;
			break;

		default:
			errcode = -pte_bad_context;
			break;
		}

		if (errcode < 0)
			return errcode;
	}
}